

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int count_files(dir_tree_t *trees)

{
  int local_24;
  undefined8 *puStack_20;
  int count;
  file_entry_t *file;
  dir_tree_t *tree;
  dir_tree_t *trees_local;
  
  local_24 = 0;
  for (file = (file_entry_t *)trees; file != (file_entry_t *)0x0; file = file->next) {
    for (puStack_20 = (undefined8 *)file->time_write; puStack_20 != (undefined8 *)0x0;
        puStack_20 = (undefined8 *)*puStack_20) {
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

int count_files(dir_tree_t *trees)
{
	dir_tree_t *tree;
	file_entry_t *file;
	int count;

	for (count = 0, tree = trees; tree != NULL; tree = tree->next)
	{
		for (file = tree->files; file != NULL; file = file->next)
		{
			count++;
		}
	}
	return count;
}